

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O2

void snestistics::asm_writer
               (ReportWriter *report,Options *options,Trace *trace,AnnotationResolver *annotations,
               RomAccessor *rom_accessor)

{
  LargeBitfield *labels;
  byte bVar1;
  byte bVar2;
  char cVar3;
  byte bVar4;
  _Rb_tree_color p;
  int iVar5;
  FILE *__s;
  pointer pAVar6;
  pointer pDVar7;
  short sVar8;
  undefined3 uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  char cVar14;
  FILE *__stream;
  bool bVar15;
  byte bVar16;
  bool bVar17;
  bool bVar18;
  uint8_t uVar19;
  ushort uVar20;
  int iVar21;
  int iVar22;
  uint32_t numBytesUsed;
  Pointer PVar23;
  OpInfo *o;
  uchar *__ptr;
  byte *data;
  ulong uVar24;
  pointer pOVar25;
  mapped_type *pmVar26;
  _Base_ptr p_Var27;
  undefined8 extraout_RAX;
  _Rb_tree_node_base *p_Var28;
  iterator iVar29;
  _Rb_tree_color target_pointer;
  pointer pOVar30;
  string *psVar31;
  string *param;
  Annotation *a_1;
  pointer pAVar32;
  _Rb_tree_color p_00;
  uint uVar33;
  undefined1 comment;
  int iVar34;
  _Base_ptr *p_01;
  int iVar35;
  vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_> *__range1;
  int iVar37;
  uint uVar38;
  ulong uVar36;
  Annotation *a;
  size_type_conflict __new_size;
  size_type_conflict sVar39;
  bool bVar40;
  allocator local_3329;
  ReportWriter *local_3328;
  byte *local_3320;
  uint local_3318;
  undefined4 local_3314;
  uint local_3310;
  int numBitsNeeded;
  ulong local_3308;
  pointer local_3300;
  uint local_32f8;
  uint local_32f4;
  uint local_32f0;
  int local_32ec;
  int local_32e8;
  int local_32e4;
  uint local_32e0;
  int local_32dc;
  vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> variants;
  AsmWriteWLADX writer;
  Proposals proposals;
  string use_comment_1;
  string line_comment;
  string name_2;
  anon_class_24_3_79b0c3fc variant_writer;
  char target_label [128];
  char target_1 [128];
  string local_3068;
  string line_comment_1;
  int local_2048;
  string line_use_comment;
  Array<unsigned_char> header;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1028 [255];
  int local_38;
  
  writer.m_nextPC = 0xffffffff;
  writer.m_bankOpen = false;
  writer.m_sectionCounter = 0;
  __s = (FILE *)report->report;
  pAVar6 = (annotations->_annotations).
           super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  labels = &trace->labels;
  writer.m_options = options;
  writer.m_romData = rom_accessor;
  writer.m_outFile = (FILE *)__s;
  writer.m_report = report;
  for (pAVar32 = (annotations->_annotations).
                 super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_start; pAVar32 != pAVar6; pAVar32 = pAVar32 + 1
      ) {
    if ((pAVar32->type == ANNOTATION_FUNCTION) ||
       ((pAVar32->type == ANNOTATION_LINE && ((pAVar32->name)._M_string_length != 0)))) {
      LargeBitfield::set_bit(labels,pAVar32->startOfRange,true);
    }
  }
  ReportWriter::writeSeperator(report,"Header");
  if ((options->asm_header_file)._M_string_length != 0) {
    header._data = (uchar *)0x0;
    header._8_8_ = header._8_8_ & 0xffffffff00000000;
    read_file(&options->asm_header_file,&header);
    __ptr = Array<unsigned_char>::operator[](&header,0);
    fwrite(__ptr,header._8_8_ & 0xffffffff,1,(FILE *)report->report);
    fputc(10,(FILE *)report->report);
    Array<unsigned_char>::~Array(&header);
  }
  fwrite(".SNESNATIVEVECTOR      ; Define Native Mode interrupt vector table\n",0x43,1,__s);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"COP",annotations,labels,0xffe4);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"BRK",annotations,labels,0xffe6);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"ABORT",annotations,labels,0xffe8);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"NMI",annotations,labels,0xffea);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"IRQ",annotations,labels,0xffee);
  fwrite(".ENDNATIVEVECTOR\n",0x11,1,__s);
  fwrite("\n.SNESEMUVECTOR         ; Define Emulation Mode interrupt vector table\n",0x47,1,__s);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"COP",annotations,labels,0xfff4);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"ABORT",annotations,labels,0xfff8);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"NMI",annotations,labels,0xfffa);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"RESET",annotations,labels,0xfffc);
  anon_unknown.dwarf_10a01::AsmWriteWLADX::write_vector_single
            (&writer,"IRQBRK",annotations,labels,0xfffe);
  fwrite(".ENDEMUVECTOR\n",0xe,1,__s);
  ReportWriter::writeSeperator(report,"Data");
  pAVar6 = (annotations->_annotations).
           super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_3328 = report;
  for (pAVar32 = (annotations->_annotations).
                 super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_start; pAVar32 != pAVar6; pAVar32 = pAVar32 + 1
      ) {
    if (pAVar32->type == ANNOTATION_DATA) {
      sprintf((char *)&header,"$%04X",(ulong)(ushort)pAVar32->startOfRange);
      std::__cxx11::string::string
                ((string *)&line_comment_1,(char *)&header,(allocator *)&line_use_comment);
      psVar31 = &pAVar32->comment;
      if ((pAVar32->comment)._M_string_length == 0) {
        psVar31 = &pAVar32->useComment;
      }
      iVar21 = fprintf(__s,".EQU %s %s",(pAVar32->name)._M_dataplus._M_p,
                       line_comment_1._M_dataplus._M_p);
      iVar22 = 0x48;
      if (0x48 < iVar21) {
        iVar22 = iVar21;
      }
      anon_unknown.dwarf_10a01::AsmWriteWLADX::writeCommentHelper
                (&writer,iVar21,(iVar22 - 0x45U & 0xfffffffc) + 0x48,psVar31);
      std::__cxx11::string::~string((string *)&line_comment_1);
    }
  }
  ReportWriter::writeSeperator(local_3328,"Code");
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::reserve(&variants,0x10000)
  ;
  p_Var28 = (trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_00 = ~_S_red;
  do {
    if ((_Rb_tree_header *)p_Var28 == &(trace->ops)._M_t._M_impl.super__Rb_tree_header) {
      std::_Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::~_Vector_base
                (&variants.
                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>);
      anon_unknown.dwarf_10a01::AsmWriteWLADX::~AsmWriteWLADX(&writer);
      return;
    }
    p = p_Var28[1]._M_color;
    if (p_00 == ~_S_red) {
      p_00 = p;
    }
    bVar17 = false;
    for (; p_00 <= p; p_00 = p_00 + _S_black) {
      if ((labels->_state[p_00 >> 5] >> (p_00 & 0x1f) & 1) != 0) {
        header._data = (uchar *)local_1028;
        header._size = 0;
        header._12_4_ = 0;
        line_comment_1._M_dataplus._M_p = (pointer)&line_comment_1.field_2;
        line_comment_1._M_string_length = 0;
        local_1028[0]._M_local_buf[0] = '\0';
        line_comment_1.field_2._M_local_buf[0] = '\0';
        line_use_comment._M_dataplus._M_p = (pointer)&line_use_comment.field_2;
        line_use_comment._M_string_length = 0;
        line_use_comment.field_2._M_local_buf[0] = '\0';
        psVar31 = &line_use_comment;
        AnnotationResolver::line_info
                  (annotations,p_00,(string *)&header,&line_comment_1,psVar31,true);
        comment = SUB81(psVar31,0);
        std::__cxx11::string::string((string *)target_1,(string *)&line_comment_1);
        if (line_comment_1._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)target_1);
        }
        std::__cxx11::string::string((string *)target_label,(string *)target_1);
        std::__cxx11::string::string((string *)&proposals,"",(allocator *)&line_comment);
        anon_unknown.dwarf_10a01::AsmWriteWLADX::prepareWrite(&writer,p_00,true);
        __stream = writer.m_outFile;
        fputc(10,(FILE *)writer.m_outFile);
        if (target_label._8_8_ != 0) {
          anon_unknown.dwarf_10a01::AsmWriteWLADX::writeCommentHelper
                    (&writer,0,0,(string *)target_label);
        }
        iVar22 = fprintf((FILE *)__stream,"%s:",header._data);
        if (CONCAT44(proposals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                     proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_color) != 0) {
          iVar21 = iVar22;
          if (iVar22 < 0x49) {
            iVar21 = 0x48;
          }
          anon_unknown.dwarf_10a01::AsmWriteWLADX::indent_column
                    ((AsmWriteWLADX *)__stream,(FILE *)(ulong)((iVar21 - 0x45U & 0xfffffffc) + 0x48)
                     ,iVar22,0,(bool)comment);
          fprintf((FILE *)__stream,"; %s",proposals._M_t._M_impl._0_8_);
        }
        fputc(10,(FILE *)__stream);
        std::__cxx11::string::~string((string *)&proposals);
        std::__cxx11::string::~string((string *)target_label);
        bVar17 = (bool)(bVar17 | p == p_00);
        std::__cxx11::string::~string((string *)target_1);
        std::__cxx11::string::~string((string *)&line_use_comment);
        std::__cxx11::string::~string((string *)&line_comment_1);
        std::__cxx11::string::~string((string *)&header);
      }
    }
    uVar24 = *(ulong *)&p_Var28[1].field_0x4;
    uVar36 = uVar24 >> 0x20;
    if (uVar36 == 0) {
      __assert_fail("variant_lookup.count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x26d,
                    "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                   );
    }
    data = RomAccessor::evalPtr(rom_accessor,p);
    bVar2 = *data;
    uVar24 = uVar24 & 0xffffffff;
    local_3328 = (ReportWriter *)(uVar24 * 0x14);
    pOVar25 = (trace->ops_variants).
              super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
              super__Vector_impl_data._M_start + uVar24;
    uVar38._0_2_ = pOVar25->P;
    uVar38._2_2_ = pOVar25->DP;
    local_3318 = 1 << ((byte)p & 0x1f) & (trace->is_predicted)._state[p >> 5];
    if ((uVar38 >> 8 & 1) != 0) {
      printf("emu mode at pc %06X\n",(ulong)p);
    }
    target_1[0x70] = '\0';
    target_1[0x71] = '\0';
    target_1[0x72] = '\0';
    target_1[0x73] = '\0';
    target_1[0x74] = '\0';
    target_1[0x75] = '\0';
    target_1[0x76] = '\0';
    target_1[0x77] = '\0';
    target_1[0x78] = '\0';
    target_1[0x79] = '\0';
    target_1[0x7a] = '\0';
    target_1[0x7b] = '\0';
    target_1[0x7c] = '\0';
    target_1[0x7d] = '\0';
    target_1[0x7e] = '\0';
    target_1[0x7f] = '\0';
    target_1[0x60] = '\0';
    target_1[0x61] = '\0';
    target_1[0x62] = '\0';
    target_1[99] = '\0';
    target_1[100] = '\0';
    target_1[0x65] = '\0';
    target_1[0x66] = '\0';
    target_1[0x67] = '\0';
    target_1[0x68] = '\0';
    target_1[0x69] = '\0';
    target_1[0x6a] = '\0';
    target_1[0x6b] = '\0';
    target_1[0x6c] = '\0';
    target_1[0x6d] = '\0';
    target_1[0x6e] = '\0';
    target_1[0x6f] = '\0';
    target_1[0x50] = '\0';
    target_1[0x51] = '\0';
    target_1[0x52] = '\0';
    target_1[0x53] = '\0';
    target_1[0x54] = '\0';
    target_1[0x55] = '\0';
    target_1[0x56] = '\0';
    target_1[0x57] = '\0';
    target_1[0x58] = '\0';
    target_1[0x59] = '\0';
    target_1[0x5a] = '\0';
    target_1[0x5b] = '\0';
    target_1[0x5c] = '\0';
    target_1[0x5d] = '\0';
    target_1[0x5e] = '\0';
    target_1[0x5f] = '\0';
    target_1[0x40] = '\0';
    target_1[0x41] = '\0';
    target_1[0x42] = '\0';
    target_1[0x43] = '\0';
    target_1[0x44] = '\0';
    target_1[0x45] = '\0';
    target_1[0x46] = '\0';
    target_1[0x47] = '\0';
    target_1[0x48] = '\0';
    target_1[0x49] = '\0';
    target_1[0x4a] = '\0';
    target_1[0x4b] = '\0';
    target_1[0x4c] = '\0';
    target_1[0x4d] = '\0';
    target_1[0x4e] = '\0';
    target_1[0x4f] = '\0';
    target_1[0x30] = '\0';
    target_1[0x31] = '\0';
    target_1[0x32] = '\0';
    target_1[0x33] = '\0';
    target_1[0x34] = '\0';
    target_1[0x35] = '\0';
    target_1[0x36] = '\0';
    target_1[0x37] = '\0';
    target_1[0x38] = '\0';
    target_1[0x39] = '\0';
    target_1[0x3a] = '\0';
    target_1[0x3b] = '\0';
    target_1[0x3c] = '\0';
    target_1[0x3d] = '\0';
    target_1[0x3e] = '\0';
    target_1[0x3f] = '\0';
    target_1[0x20] = '\0';
    target_1[0x21] = '\0';
    target_1[0x22] = '\0';
    target_1[0x23] = '\0';
    target_1[0x24] = '\0';
    target_1[0x25] = '\0';
    target_1[0x26] = '\0';
    target_1[0x27] = '\0';
    target_1[0x28] = '\0';
    target_1[0x29] = '\0';
    target_1[0x2a] = '\0';
    target_1[0x2b] = '\0';
    target_1[0x2c] = '\0';
    target_1[0x2d] = '\0';
    target_1[0x2e] = '\0';
    target_1[0x2f] = '\0';
    target_1[0x10] = '\0';
    target_1[0x11] = '\0';
    target_1[0x12] = '\0';
    target_1[0x13] = '\0';
    target_1[0x14] = '\0';
    target_1[0x15] = '\0';
    target_1[0x16] = '\0';
    target_1[0x17] = '\0';
    target_1[0x18] = '\0';
    target_1[0x19] = '\0';
    target_1[0x1a] = '\0';
    target_1[0x1b] = '\0';
    target_1[0x1c] = '\0';
    target_1[0x1d] = '\0';
    target_1[0x1e] = '\0';
    target_1[0x1f] = '\0';
    target_1[0] = '\0';
    target_1[1] = '\0';
    target_1[2] = '\0';
    target_1[3] = '\0';
    target_1[4] = '\0';
    target_1[5] = '\0';
    target_1[6] = '\0';
    target_1[7] = '\0';
    target_1[8] = '\0';
    target_1[9] = '\0';
    target_1[10] = '\0';
    target_1[0xb] = '\0';
    target_1[0xc] = '\0';
    target_1[0xd] = '\0';
    target_1[0xe] = '\0';
    target_1[0xf] = '\0';
    target_label[0x70] = '\0';
    target_label[0x71] = '\0';
    target_label[0x72] = '\0';
    target_label[0x73] = '\0';
    target_label[0x74] = '\0';
    target_label[0x75] = '\0';
    target_label[0x76] = '\0';
    target_label[0x77] = '\0';
    target_label[0x78] = '\0';
    target_label[0x79] = '\0';
    target_label[0x7a] = '\0';
    target_label[0x7b] = '\0';
    target_label[0x7c] = '\0';
    target_label[0x7d] = '\0';
    target_label[0x7e] = '\0';
    target_label[0x7f] = '\0';
    target_label[0x60] = '\0';
    target_label[0x61] = '\0';
    target_label[0x62] = '\0';
    target_label[99] = '\0';
    target_label[100] = '\0';
    target_label[0x65] = '\0';
    target_label[0x66] = '\0';
    target_label[0x67] = '\0';
    target_label[0x68] = '\0';
    target_label[0x69] = '\0';
    target_label[0x6a] = '\0';
    target_label[0x6b] = '\0';
    target_label[0x6c] = '\0';
    target_label[0x6d] = '\0';
    target_label[0x6e] = '\0';
    target_label[0x6f] = '\0';
    target_label[0x50] = '\0';
    target_label[0x51] = '\0';
    target_label[0x52] = '\0';
    target_label[0x53] = '\0';
    target_label[0x54] = '\0';
    target_label[0x55] = '\0';
    target_label[0x56] = '\0';
    target_label[0x57] = '\0';
    target_label[0x58] = '\0';
    target_label[0x59] = '\0';
    target_label[0x5a] = '\0';
    target_label[0x5b] = '\0';
    target_label[0x5c] = '\0';
    target_label[0x5d] = '\0';
    target_label[0x5e] = '\0';
    target_label[0x5f] = '\0';
    target_label[0x40] = '\0';
    target_label[0x41] = '\0';
    target_label[0x42] = '\0';
    target_label[0x43] = '\0';
    target_label[0x44] = '\0';
    target_label[0x45] = '\0';
    target_label[0x46] = '\0';
    target_label[0x47] = '\0';
    target_label[0x48] = '\0';
    target_label[0x49] = '\0';
    target_label[0x4a] = '\0';
    target_label[0x4b] = '\0';
    target_label[0x4c] = '\0';
    target_label[0x4d] = '\0';
    target_label[0x4e] = '\0';
    target_label[0x4f] = '\0';
    target_label[0x30] = '\0';
    target_label[0x31] = '\0';
    target_label[0x32] = '\0';
    target_label[0x33] = '\0';
    target_label[0x34] = '\0';
    target_label[0x35] = '\0';
    target_label[0x36] = '\0';
    target_label[0x37] = '\0';
    target_label[0x38] = '\0';
    target_label[0x39] = '\0';
    target_label[0x3a] = '\0';
    target_label[0x3b] = '\0';
    target_label[0x3c] = '\0';
    target_label[0x3d] = '\0';
    target_label[0x3e] = '\0';
    target_label[0x3f] = '\0';
    target_label[0x20] = '\0';
    target_label[0x21] = '\0';
    target_label[0x22] = '\0';
    target_label[0x23] = '\0';
    target_label[0x24] = '\0';
    target_label[0x25] = '\0';
    target_label[0x26] = '\0';
    target_label[0x27] = '\0';
    target_label[0x28] = '\0';
    target_label[0x29] = '\0';
    target_label[0x2a] = '\0';
    target_label[0x2b] = '\0';
    target_label[0x2c] = '\0';
    target_label[0x2d] = '\0';
    target_label[0x2e] = '\0';
    target_label[0x2f] = '\0';
    target_label[0x10] = '\0';
    target_label[0x11] = '\0';
    target_label[0x12] = '\0';
    target_label[0x13] = '\0';
    target_label[0x14] = '\0';
    target_label[0x15] = '\0';
    target_label[0x16] = '\0';
    target_label[0x17] = '\0';
    target_label[0x18] = '\0';
    target_label[0x19] = '\0';
    target_label[0x1a] = '\0';
    target_label[0x1b] = '\0';
    target_label[0x1c] = '\0';
    target_label[0x1d] = '\0';
    target_label[0x1e] = '\0';
    target_label[0x1f] = '\0';
    target_label[0] = '\0';
    target_label[1] = '\0';
    target_label[2] = '\0';
    target_label[3] = '\0';
    target_label[4] = '\0';
    target_label[5] = '\0';
    target_label[6] = '\0';
    target_label[7] = '\0';
    target_label[8] = '\0';
    target_label[9] = '\0';
    target_label[10] = '\0';
    target_label[0xb] = '\0';
    target_label[0xc] = '\0';
    target_label[0xd] = '\0';
    target_label[0xe] = '\0';
    target_label[0xf] = '\0';
    numBitsNeeded = 8;
    local_3320 = data;
    numBytesUsed = calculateFormattingandSize
                             (data,(uVar38 & 0x20) == 0,(uVar38 & 0x10) == 0,target_1,target_label,
                              &numBitsNeeded);
    proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &proposals._M_t._M_impl.super__Rb_tree_header._M_header;
    proposals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cVar3 = (&jumps)[bVar2];
    uVar38 = *(uint *)(op_codes + (ulong)bVar2 * 0x10 + 8);
    bVar16 = (byte)uVar38;
    local_3310 = 0x81a034 >> (bVar16 & 0x1f);
    proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar15 = cputable::address_depend_db(bVar2);
    if (cVar3 == '\0') {
      local_3314 = CONCAT31((int3)(*(int *)(op_codes + (ulong)bVar2 * 0x10 + 8) - 0xbU >> 8),
                            *(int *)(op_codes + (ulong)bVar2 * 0x10 + 8) - 0xbU < 8);
    }
    else {
      local_3314 = 0;
    }
    std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::resize(&variants,uVar36)
    ;
    p_00 = p + numBytesUsed;
    local_3310 = CONCAT31((int3)(local_3310 >> 8),(byte)local_3310 & uVar38 < 0x18);
    bVar1 = uVar38 < 0xe & (byte)(0x3086 >> (bVar16 & 0x1f));
    bVar16 = (byte)(0x854008 >> (bVar16 & 0x1f)) & uVar38 < 0x18;
    memcpy(variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
           _M_impl.super__Vector_impl_data._M_start,
           (void *)((long)&((trace->ops_variants).
                            super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start)->indirect_base_pointer +
                   (long)local_3328),uVar36 * 0x14);
    local_3300 = variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    iVar21 = 1;
    local_32ec = 0;
    local_32f0 = 0;
    local_32f4 = 0;
    iVar22 = 1;
    local_32dc = 0;
    local_3328 = (ReportWriter *)((ulong)local_3328 & 0xffffffff00000000);
    iVar35 = 1;
    local_32e4 = 0;
    uVar38 = 0;
    iVar34 = 1;
    local_32e8 = 0;
    for (pOVar25 = variants.
                   super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start; local_32e0 = uVar38 & 0xff,
        pOVar25 !=
        variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish; pOVar25 = pOVar25 + 1) {
      bVar40 = (pOVar25->P & 0x20) == 0;
      uVar33 = local_32f4;
      if (SUB41(local_32f4,0) != bVar40) {
        uVar33 = 0;
        iVar22 = 0;
      }
      local_32f4 = (uint)bVar40;
      if (local_32dc != 0) {
        local_32f4 = uVar33;
      }
      local_3308 = CONCAT44(local_3308._4_4_,local_32f4);
      if (local_32dc == 0) {
        iVar22 = 1;
        local_32dc = 1;
      }
      bVar40 = (pOVar25->P & 0x10) == 0;
      if (SUB41(local_32f0,0) != bVar40) {
        iVar21 = 0;
        local_32f0 = 0;
      }
      if (local_32ec == 0) {
        iVar21 = 1;
        local_32ec = 1;
        local_32f0 = (uint)bVar40;
      }
      uVar33 = (uint)local_3328;
      if ((ushort)local_3328 != pOVar25->DP) {
        iVar35 = 0;
        uVar33 = 0;
      }
      if (local_32e4 == 0) {
        uVar33 = (uint)pOVar25->DP;
      }
      local_3328 = (ReportWriter *)CONCAT44(local_3328._4_4_,uVar33);
      if (local_32e4 == 0) {
        iVar35 = 1;
        local_32e4 = 1;
      }
      if ((char)uVar38 != (char)*(uint *)&pOVar25->DB) {
        local_32e0 = 0;
        iVar34 = 0;
      }
      uVar38 = local_32e0;
      if (local_32e8 == 0) {
        iVar34 = 1;
        local_32e8 = 1;
        uVar38 = *(uint *)&pOVar25->DB;
      }
      if (bVar1 == 0) {
        pOVar25->X = 0;
      }
      if (bVar16 == 0) {
        pOVar25->Y = 0;
      }
      if (!bVar15) {
        pOVar25->DB = '\0';
      }
      if ((char)local_3314 == '\0') {
        pOVar25->DP = 0;
      }
      if ((char)local_3310 == '\0') {
        pOVar25->indirect_base_pointer = 0;
      }
    }
    if (bVar2 == 0x82) {
      header._data = (uchar *)CONCAT44(header._data._4_4_,
                                       (uint)(-1 < (short)((ushort)local_3320[2] << 8)) * 0x10000 +
                                       *(ushort *)(local_3320 + 1) + p + -0xfffd);
      pmVar26 = std::
                map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&proposals,(key_type *)&header);
      std::__cxx11::string::assign((char *)pmVar26);
    }
    else if ((&branches)[bVar2] == '\x01') {
      header._data = (uchar *)CONCAT44(header._data._4_4_,
                                       (uint)(-1 < (char)local_3320[1]) * 0x100 + local_3320[1] + p
                                       + -0xfe);
      pmVar26 = std::
                map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&proposals,(key_type *)&header);
      std::__cxx11::string::assign((char *)pmVar26);
    }
    else {
      std::
      __sort<__gnu_cxx::__normal_iterator<snestistics::OpInfo*,std::vector<snestistics::OpInfo,std::allocator<snestistics::OpInfo>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      uVar38 = 0;
      __new_size = 0;
      while( true ) {
        uVar24 = (ulong)uVar38;
        iVar37 = (int)__new_size;
        if ((ulong)(((long)variants.
                           super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x14) <= uVar24) break;
        if ((iVar37 == 0) ||
           (bVar40 = OpInfo::operator!=(variants.
                                        super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar24,
                                        variants.
                                        super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start + (iVar37 - 1)),
           sVar39 = __new_size, bVar40)) {
          sVar39 = (size_type_conflict)(iVar37 + 1);
          uVar9 = *(undefined3 *)
                   &variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar24].field_0x11;
          variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
          _M_impl.super__Vector_impl_data._M_start[__new_size].DB =
               variants.
               super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl
               .super__Vector_impl_data._M_start[uVar24].DB;
          *(undefined3 *)
           &variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
            _M_impl.super__Vector_impl_data._M_start[__new_size].field_0x11 = uVar9;
          pOVar25 = variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start + uVar24;
          PVar23 = pOVar25->jump_target;
          uVar10 = pOVar25->P;
          uVar11 = pOVar25->DP;
          uVar12 = pOVar25->X;
          uVar13 = pOVar25->Y;
          pOVar30 = variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start + __new_size;
          pOVar30->indirect_base_pointer = pOVar25->indirect_base_pointer;
          pOVar30->jump_target = PVar23;
          pOVar30->P = uVar10;
          pOVar30->DP = uVar11;
          pOVar30->X = uVar12;
          pOVar30->Y = uVar13;
        }
        uVar38 = uVar38 + 1;
        __new_size = sVar39;
      }
      std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::resize
                (&variants,__new_size);
      if (cVar3 == '\0') {
        if (local_3318 == 0) {
          local_3308 = (ulong)(bVar1 ^ 1) * 2 + 0xc;
          local_32f8 = p >> 0x10;
          sVar8 = (short)p;
          cVar14 = (char)local_3314;
          uVar24 = 0;
          while (pOVar25 = variants.
                           super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start, iVar37 = (int)uVar24,
                uVar24 < (ulong)(((long)variants.
                                        super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)variants.
                                       super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x14)) {
            memset((StringBuilder *)&header,0,0x1004);
            if (bVar1 != 0 || bVar16 != 0) {
              if (bVar1 != 0) {
                StringBuilder::add((StringBuilder *)&header,"X=");
              }
              if (bVar16 != 0) {
                StringBuilder::add((StringBuilder *)&header,"Y=");
              }
              line_comment_1._M_dataplus._M_p = (pointer)0xffffffff;
              line_comment_1._M_string_length = line_comment_1._M_string_length & 0xffffffff00000000
              ;
              Range::add((Range *)&line_comment_1,
                         (uint)*(ushort *)
                                ((long)&pOVar25[uVar24].indirect_base_pointer + local_3308));
              local_3300 = (pointer)((ulong)local_3300 & 0xffffffff00000000);
              bVar40 = true;
              uVar36 = uVar24;
              while( true ) {
                iVar37 = (int)uVar36;
                uVar36 = (ulong)(iVar37 + 1U);
                if ((((ulong)(((long)variants.
                                     super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)variants.
                                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x14) <= uVar36) ||
                    (variants.
                     super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar36].DB != pOVar25[uVar24].DB)) ||
                   (variants.
                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar36].DP != pOVar25[uVar24].DP))
                break;
                uVar20 = *(ushort *)
                          ((long)&variants.
                                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar36].
                                  indirect_base_pointer + local_3308);
                bVar18 = Range::fits((Range *)&line_comment_1,(uint)uVar20);
                if (bVar18) {
                  Range::add((Range *)&line_comment_1,(uint)uVar20);
                  uVar36 = (ulong)(iVar37 + 1U);
                }
                else {
                  if (local_38 < 0x50) {
                    if (!bVar40) {
                      StringBuilder::add((StringBuilder *)&header,", ");
                    }
                    Range::format((Range *)&line_comment_1,(StringBuilder *)&header);
                    bVar40 = false;
                  }
                  else {
                    local_3300 = (pointer)CONCAT44(local_3300._4_4_,(int)local_3300 + 1);
                  }
                  uVar36 = (ulong)(iVar37 + 1);
                  line_comment_1._M_dataplus._M_p = (pointer)0xffffffff;
                  line_comment_1._M_string_length =
                       line_comment_1._M_string_length & 0xffffffff00000000;
                  Range::add((Range *)&line_comment_1,(uint)uVar20);
                }
              }
              if ((int)local_3300 == 0) {
                if (!bVar40) {
                  StringBuilder::add((StringBuilder *)&header,", ");
                }
                Range::format((Range *)&line_comment_1,(StringBuilder *)&header);
              }
              else {
                StringBuilder::format((StringBuilder *)&header," and %d more");
              }
            }
            bVar2 = *local_3320;
            uVar36 = (ulong)bVar2;
            iVar5 = *(int *)(opCodeInfo + uVar36 * 0x18 + 0x10);
            if (iVar5 < 4) goto switchD_001301d0_caseD_d;
            uVar38 = local_32f8;
            if (iVar5 == 4) {
              bVar2 = local_3320[1];
              uVar20 = sVar8 + -0xfe + (ushort)bVar2;
              if (-1 < (char)bVar2) {
                uVar20 = sVar8 + 2 + (ushort)bVar2;
              }
              goto LAB_0012fffe;
            }
            if ((uVar36 == 0x82) || (bVar2 == 0x62)) {
              uVar20 = (*(ushort *)(local_3320 + 1) << 8 | *(ushort *)(local_3320 + 1) >> 8) +
                       sVar8 + 3;
              goto LAB_0012fffe;
            }
            bVar4 = pOVar25[uVar24].DB;
            switch(iVar5) {
            case 6:
              uVar20 = pOVar25[uVar24].DP + (ushort)local_3320[1];
              uVar38 = 0;
              goto LAB_0012fffe;
            default:
              if (bVar2 == 0xdc) {
                if ((&jumps)[uVar36] != '\0') {
                  bVar4 = (byte)local_32f8;
                }
                if (((char)local_3320[2] < '\0') && ((char)bVar4 < '~')) {
                  uVar38 = (uint)bVar4 << 0x10 | (uint)local_3320[2] << 8 | (uint)local_3320[1];
                  uVar19 = RomAccessor::evalByte(rom_accessor,uVar38);
                  local_3300 = (pointer)CONCAT71(local_3300._1_7_,uVar19);
                  uVar19 = RomAccessor::evalByte(rom_accessor,uVar38 + 1);
                  uVar20 = CONCAT11(uVar19,local_3300._0_1_);
                  uVar38 = (uint)bVar4;
                  goto LAB_0012fffe;
                }
              }
              else if (((bVar2 & 0x7f) == 0x7c) && ((&jumps)[uVar36] == '\0')) {
                __assert_fail("is_jump",
                              "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                              ,0xb4,
                              "ResultType (anonymous namespace)::evaluateOp(const snestistics::RomAccessor &, const uint8_t *, const CPURegisters &, MagicByte *, MagicWord *, bool *, bool *, bool *, bool *)"
                             );
              }
              break;
            case 0xd:
              break;
            case 0xe:
            case 0xf:
            case 0x10:
              goto LAB_001301e2;
            case 0x11:
            case 0x12:
              bVar4 = local_3320[3];
LAB_001301e2:
              uVar20 = *(ushort *)(local_3320 + 1);
              uVar38 = (uint)bVar4;
LAB_0012fffe:
              PVar23 = RomAccessor::lorom_bank_remap
                                 (rom_accessor,(uint)uVar20 | (uVar38 & 0xff) << 0x10);
              line_comment._M_dataplus._M_p._0_4_ = PVar23;
              iVar29 = std::
                       _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::find(&proposals._M_t,(key_type *)&line_comment);
              iVar5 = local_38;
              if ((_Rb_tree_header *)iVar29._M_node == &proposals._M_t._M_impl.super__Rb_tree_header
                 ) {
                line_use_comment._M_dataplus._M_p = (pointer)&line_use_comment.field_2;
                line_use_comment._M_string_length = 0;
                line_use_comment.field_2._M_local_buf[0] = '\0';
                if (bVar15 || cVar14 != '\0') {
                  memset(&line_comment_1,0,0x1004);
LAB_001300b2:
                  StringBuilder::add((StringBuilder *)&line_comment_1,"[");
                  bVar40 = true;
                }
                else {
                  bVar40 = false;
                  memset(&line_comment_1,0,0x1004);
                  if (iVar5 != 0) goto LAB_001300b2;
                }
                bVar18 = !bVar15;
                if (!bVar18) {
                  StringBuilder::format
                            ((StringBuilder *)&line_comment_1,"DB=%X",(ulong)pOVar25[uVar24].DB);
                }
                if ((char)local_3314 != '\0') {
                  if (!bVar18) {
                    StringBuilder::add((StringBuilder *)&line_comment_1," ");
                  }
                  bVar18 = false;
                  StringBuilder::format
                            ((StringBuilder *)&line_comment_1,"DP=%X",(ulong)pOVar25[uVar24].DP);
                }
                if (local_38 != 0) {
                  if (!bVar18) {
                    StringBuilder::add((StringBuilder *)&line_comment_1," ");
                  }
                  StringBuilder::add((StringBuilder *)&line_comment_1,(char *)&header);
                }
                if (bVar40) {
                  StringBuilder::add((StringBuilder *)&line_comment_1,"]");
                }
                pmVar26 = std::
                          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&proposals,(key_type *)&line_comment);
                std::__cxx11::string::assign((char *)pmVar26);
                std::__cxx11::string::~string((string *)&line_use_comment);
              }
            }
switchD_001301d0_caseD_d:
            uVar24 = (ulong)(iVar37 + 1);
          }
        }
      }
      else {
        for (uVar38 = 0;
            pOVar25 = variants.
                      super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start, uVar24 = (ulong)uVar38,
            uVar24 < (ulong)(((long)variants.
                                    super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)variants.
                                   super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x14);
            uVar38 = uVar38 + 1) {
          if (variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar24].jump_target != 0xffffffff) {
            memset(&header,0,0x1004);
            if (bVar1 != 0) {
              StringBuilder::format((StringBuilder *)&header,"[X=%04X]",(ulong)pOVar25[uVar24].X);
            }
            pmVar26 = std::
                      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&proposals,&pOVar25[uVar24].jump_target);
            std::__cxx11::string::assign((char *)pmVar26);
          }
        }
      }
    }
    line_comment._M_dataplus._M_p = (pointer)&line_comment.field_2;
    line_comment._M_string_length = 0;
    line_comment.field_2._M_local_buf[0] = '\0';
    if (!bVar17) {
      AnnotationResolver::line_info(annotations,p,(string *)0x0,&line_comment,(string *)0x0,false);
    }
    variant_writer.line_comment = &line_comment;
    variant_writer.annotations = annotations;
    variant_writer.is_jump = (bool)cVar3;
    memset((StringBuilder *)&header,0,0x1004);
    iVar37 = numBitsNeeded;
    uVar38 = (uint)(ushort)local_3328;
    if (proposals._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
      cVar14 = target_label[0];
      asm_writer::anon_class_24_3_79b0c3fc::operator()
                (&line_use_comment,&variant_writer,(StringBuilder *)&header,
                 proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color,
                 (Proposal *)
                 &proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent,
                 target_label[0] != '\0');
      if ((cVar14 == '\0') || (line_use_comment._M_string_length == 0)) {
        local_3328 = (ReportWriter *)CONCAT44(local_3328._4_4_,numBitsNeeded);
        std::__cxx11::string::string((string *)&line_comment_1,target_1,(allocator *)&name_2);
        iVar37 = local_32dc;
        uVar33 = local_32e0;
        psVar31 = &use_comment_1;
        std::__cxx11::string::string((string *)psVar31,(char *)&header,(allocator *)&local_3068);
        param = &line_comment_1;
        anon_unknown.dwarf_10a01::AsmWriteWLADX::writeInstruction
                  (&writer,p,(uint)local_3328,numBytesUsed,param,psVar31,
                   (CombinationBool)
                   (((uint3)(iVar22 << 8) | (uint3)(iVar37 << 0x10)) + (int3)local_32f4),
                   (CombinationBool)
                   (((uint3)(iVar21 << 8) | (uint3)(local_32ec << 0x10)) + (int3)local_32f0),
                   (Combination8)
                   ((uint3)(iVar34 << 8) | (uint3)(local_32e8 << 0x10) | (uint3)uVar33),
                   (Combination16)(iVar35 << 0x10 | local_32e4 << 0x18 | uVar38),local_3318 != 0);
      }
      else {
        sprintf((char *)&line_comment_1,target_label,line_use_comment._M_dataplus._M_p);
        local_3328 = (ReportWriter *)CONCAT44(local_3328._4_4_,numBitsNeeded);
        std::__cxx11::string::string
                  ((string *)&use_comment_1,(char *)&line_comment_1,(allocator *)&local_3068);
        iVar37 = local_32dc;
        uVar33 = local_32e0;
        psVar31 = &name_2;
        std::__cxx11::string::string((string *)psVar31,(char *)&header,&local_3329);
        param = &use_comment_1;
        anon_unknown.dwarf_10a01::AsmWriteWLADX::writeInstruction
                  (&writer,p,(uint)local_3328,numBytesUsed,param,psVar31,
                   (CombinationBool)
                   (((uint3)(iVar22 << 8) | (uint3)(iVar37 << 0x10)) + (int3)local_32f4),
                   (CombinationBool)
                   (((uint3)(iVar21 << 8) | (uint3)(local_32ec << 0x10)) + (int3)local_32f0),
                   (Combination8)
                   ((uint3)(iVar34 << 8) | (uint3)(local_32e8 << 0x10) | (uint3)uVar33),
                   (Combination16)(iVar35 << 0x10 | local_32e4 << 0x18 | uVar38),local_3318 != 0);
      }
      std::__cxx11::string::~string((string *)psVar31);
      std::__cxx11::string::~string((string *)param);
      std::__cxx11::string::~string((string *)&line_use_comment);
    }
    else {
      std::__cxx11::string::string
                ((string *)&line_comment_1,target_1,(allocator *)&line_use_comment);
      anon_unknown.dwarf_10a01::AsmWriteWLADX::writeInstruction
                (&writer,p,iVar37,numBytesUsed,&line_comment_1,&line_comment,
                 (CombinationBool)
                 (((uint3)(iVar22 << 8) | (uint3)(local_32dc << 0x10)) + (int3)local_32f4),
                 (CombinationBool)
                 (((uint3)(iVar21 << 8) | (uint3)(local_32ec << 0x10)) + (int3)local_32f0),
                 (Combination8)
                 (((uint3)(iVar34 << 8) | (uint3)(local_32e8 << 0x10)) + (int3)local_32e0),
                 (Combination16)(iVar35 << 0x10 | local_32e4 << 0x18 | uVar38),local_3318 != 0);
      std::__cxx11::string::~string((string *)&line_comment_1);
      for (p_Var27 = proposals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var27 != &proposals._M_t._M_impl.super__Rb_tree_header;
          p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27)) {
        target_pointer = p_Var27[1]._M_color;
        p_01 = &p_Var27[1]._M_parent;
        asm_writer::anon_class_24_3_79b0c3fc::operator()
                  (&line_comment_1,&variant_writer,(StringBuilder *)&header,target_pointer,
                   (Proposal *)p_01,false);
        iVar22 = (int)p_01;
        std::__cxx11::string::string
                  ((string *)&line_use_comment,(char *)&header,(allocator *)&use_comment_1);
        anon_unknown.dwarf_10a01::AsmWriteWLADX::writeComment
                  (&writer,p,&line_use_comment,target_pointer,iVar22);
        std::__cxx11::string::~string((string *)&line_use_comment);
        std::__cxx11::string::~string((string *)&line_comment_1);
      }
    }
    if (((local_3318 == 0) && ((char)local_3310 == '\x01')) && (cVar3 == '\0')) {
      local_3328 = (ReportWriter *)((ulong)(bVar1 ^ 1) * 2 + 0xc);
      uVar24 = 0;
      while( true ) {
        iVar22 = (int)uVar24;
        if ((ulong)(((long)variants.
                           super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)variants.
                          super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x14) <= uVar24) break;
        pOVar25 = variants.
                  super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar24;
        memset(&line_comment_1,0,0x1004);
        if (bVar1 != 0 || bVar16 != 0) {
          if (bVar1 != 0) {
            StringBuilder::add((StringBuilder *)&line_comment_1," X=");
          }
          if (bVar16 != 0) {
            StringBuilder::add((StringBuilder *)&line_comment_1," Y=");
          }
          line_use_comment._M_dataplus._M_p = (pointer)0xffffffff;
          line_use_comment._M_string_length = line_use_comment._M_string_length & 0xffffffff00000000
          ;
          Range::add((Range *)&line_use_comment,
                     (uint)*(ushort *)
                            ((long)&local_3328->report + (long)&pOVar25->indirect_base_pointer));
          uVar38 = 0;
          local_3308 = CONCAT44(local_3308._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
          while( true ) {
            iVar22 = (int)uVar24;
            uVar24 = (ulong)(iVar22 + 1);
            if ((((ulong)(((long)variants.
                                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)variants.
                                super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x14) <= uVar24) ||
                (pOVar25->DB !=
                 variants.
                 super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar24].DB)) ||
               ((pOVar30 = variants.
                           super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar24,
                pOVar25->DP != pOVar30->DP ||
                (pOVar25->indirect_base_pointer != pOVar30->indirect_base_pointer)))) break;
            uVar20 = *(ushort *)((long)&local_3328->report + (long)&pOVar30->indirect_base_pointer);
            bVar17 = Range::fits((Range *)&line_use_comment,(uint)uVar20);
            if (bVar17) {
              Range::add((Range *)&line_use_comment,(uint)uVar20);
            }
            else {
              if (local_2048 < 0x81) {
                if ((local_3308 & 1) == 0) {
                  StringBuilder::add((StringBuilder *)&line_comment_1,", ");
                }
                Range::format((Range *)&line_use_comment,(StringBuilder *)&line_comment_1);
                local_3308 = local_3308 & 0xffffffff00000000;
              }
              else {
                uVar38 = uVar38 + 1;
              }
              uVar24 = (ulong)(iVar22 + 1);
              line_use_comment._M_dataplus._M_p = (pointer)0xffffffff;
              line_use_comment._M_string_length =
                   line_use_comment._M_string_length & 0xffffffff00000000;
            }
          }
          if ((uVar38 == 0) && (line_use_comment._M_dataplus._M_p._4_4_ != 0)) {
            if ((local_3308 & 1) == 0) {
              StringBuilder::add((StringBuilder *)&line_comment_1,", ");
            }
            Range::format((Range *)&line_use_comment,(StringBuilder *)&line_comment_1);
          }
          else if (uVar38 != 0) {
            StringBuilder::format((StringBuilder *)&line_comment_1," (and %d more)",(ulong)uVar38);
          }
        }
        memset((StringBuilder *)&line_use_comment,0,0x1004);
        use_comment_1._M_dataplus._M_p = (pointer)&use_comment_1.field_2;
        use_comment_1._M_string_length = 0;
        use_comment_1.field_2._M_local_buf[0] = '\0';
        psVar31 = &use_comment_1;
        iVar35 = 0;
        AnnotationResolver::label(&name_2,annotations,pOVar25->indirect_base_pointer,psVar31,false);
        iVar21 = (int)psVar31;
        StringBuilder::format
                  ((StringBuilder *)&line_use_comment,"indirect base=%06X",
                   (ulong)pOVar25->indirect_base_pointer);
        if ((char)local_3314 != '\0') {
          StringBuilder::format((StringBuilder *)&line_use_comment,", DP=%X",(ulong)pOVar25->DP);
        }
        if (bVar15) {
          StringBuilder::format((StringBuilder *)&line_use_comment,", DB=%X",(ulong)pOVar25->DB);
        }
        if (local_2048 != 0) {
          StringBuilder::add((StringBuilder *)&line_use_comment,(char *)&line_comment_1);
        }
        if (name_2._M_string_length != 0) {
          StringBuilder::add<char[4],std::__cxx11::string>
                    ((StringBuilder *)&line_use_comment,(char (*) [4])" - ",&name_2);
        }
        if (use_comment_1._M_string_length != 0) {
          StringBuilder::add<char[4],std::__cxx11::string>
                    ((StringBuilder *)&line_use_comment,(char (*) [4])" - ",&use_comment_1);
        }
        std::__cxx11::string::string((string *)&local_3068,(char *)&line_use_comment,&local_3329);
        anon_unknown.dwarf_10a01::AsmWriteWLADX::writeComment(&writer,p,&local_3068,iVar21,iVar35);
        std::__cxx11::string::~string((string *)&local_3068);
        std::__cxx11::string::~string((string *)&name_2);
        std::__cxx11::string::~string((string *)&use_comment_1);
        uVar24 = (ulong)(iVar22 + 1);
      }
    }
    pDVar7 = (trace->dma_transfers).
             super__Vector_base<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((((long)(trace->dma_transfers).
                super__Vector_base<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar7) / 0x14 != 0) &&
       (pDVar7->pc == p)) {
      memset(&line_comment_1,0,0x1004);
      __assert_fail("d.b_address == 0x80",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x3c0,
                    "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                   );
    }
    std::__cxx11::string::~string((string *)&line_comment);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&proposals._M_t);
    p_Var28 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var28);
  } while( true );
}

Assistant:

void asm_writer(ReportWriter &report, const Options &options, Trace &trace, const AnnotationResolver &annotations, const RomAccessor &rom_accessor) {
	AsmWriteWLADX writer(report, options, rom_accessor);

	int next_dma_event = 0;

	for (const Annotation &a : annotations._annotations) {
		if (a.type == ANNOTATION_FUNCTION || (a.type == ANNOTATION_LINE && !a.name.empty()))
			trace.labels.set_bit(a.startOfRange);
	}

	writer.writeSeperator("Header");

	if (!options.asm_header_file.empty()) {
		Array<unsigned char> header;
		read_file(options.asm_header_file, header);
		fwrite(&header[0], header.size(), 1, report.report);
		char newline = '\n';
		fwrite(&newline, 1, 1, report.report);
	}

	writer.write_vectors(annotations, trace.labels);

	writer.writeSeperator("Data");

	// Generate EQU for each label
	// TODO: Only include USED labels?
	for (const Annotation &a : annotations._annotations) {
		if (a.type != ANNOTATION_DATA)
			continue;

		// NOTE: We only use 16-bit here... the high byte is almost never used in an op
		// TODO: Validate so this doesn't mess thing up when we use it
		char target[512];
		sprintf(target, "$%04X", a.startOfRange&0xFFFF);
		writer.writeDefine(a.name, target, a.comment.empty() ? a.useComment : a.comment);
	}

	writer.writeSeperator("Code");

	Pointer nextOp(INVALID_POINTER);

	std::vector<OpInfo> variants;
	variants.reserve(1024*64);

	// Now iterate the ops
	for (auto opsit = trace.ops.begin(); opsit != trace.ops.end(); ++opsit) {
		const Pointer pc = opsit->first;

		if (nextOp == INVALID_POINTER) {
			nextOp = pc;
		}

		bool emitted_label = false;

		// TODO: Emit any labels that we might have skipped as well as label for current line
		//       This is mostly if the static jump predictor is predicting a jump into non-ops.
		for (Pointer p(nextOp); p <= pc; ++p) {
			if (trace.labels[p]) {
				// Emit label?
				std::string label, line_comment, line_use_comment;

				annotations.line_info(p, &label, &line_comment, &line_use_comment, true);

				std::string description = line_comment;
				if (line_comment.empty()) {
					description = line_use_comment;
				}

				bool shortmode = false;//!multiline && description.size() < 20;

				writer.writeLabel(p, label, shortmode ? "" : description, shortmode ? description : "");

				if (p == pc)
					emitted_label = true;
			}
		}

		const Trace::OpVariantLookup variant_lookup = opsit->second;
		assert(variant_lookup.count != 0);

		const uint8_t *data = rom_accessor.evalPtr(pc);
		const uint8_t opcode = *data;

		// Determine number of bytes needed for this instruction
		// Here I've assumed that either these flags agree for ALL variants, or that they are irrelevant for this opcode
		const OpInfo &first_variant = trace.variant(variant_lookup, 0);
		const bool acc16 = is_memory_accumulator_wide(first_variant.P);
		const bool ind16 = is_index_wide(first_variant.P);
		const bool emu   = is_emulation_mode(first_variant.P);
		const bool is_predicted = trace.is_predicted[pc];
		if (emu) printf("emu mode at pc %06X\n", pc);

		char target[128] = "\0";
		char target_label[128] = "\0";
		int numBitsNeeded = 8;

		const uint32_t numBytesNeeded = calculateFormattingandSize(data, acc16, ind16, target, target_label, &numBitsNeeded);

		nextOp = pc + numBytesNeeded;

		typedef std::string Proposal;
		typedef std::map<Pointer, Proposal> Proposals;
		Proposals proposals; // Given destionation/source give comment on how we got there

		const bool is_jump = jumps[opcode]; // TODO: Cover all jumps we want? And not too many?

		// Does adress depend on ....?
		bool is_indirect = cputable::is_indirect(opcode);
		const bool depend_X = cputable::address_depend_x(opcode);
		const bool depend_Y = cputable::address_depend_y(opcode);
		const bool depend_DB = cputable::address_depend_db(opcode);
		const bool depend_DP = is_jump ? false : cputable::address_depend_dp(opcode);

		// First copy all variants into our local vector where we can modify
		variants.resize(variant_lookup.count);
		memcpy(&variants[0], &trace.ops_variants[variant_lookup.offset], variant_lookup.count * sizeof(OpInfo));

		// These know if they have been assigned no value, one value (maybe multiple times) or multiple different values
		Combination8 shared_db;
		Combination16 shared_dp;
		CombinationBool accumulator_wide;
		CombinationBool index_wide;

		{
			// NOTE-TODO: While an op might depend on say DB it might not use it if adress is in $0000-$1999

			// Zero out unused registers so our sort get items in correct order
			for (OpInfo &o : variants) {
				accumulator_wide = is_memory_accumulator_wide(o.P);
				index_wide = is_index_wide(o.P);
				shared_dp = o.DP;
				shared_db = o.DB;
				if (!depend_X) o.X = 0;
				if (!depend_Y) o.Y = 0;
				if (!depend_DB) o.DB = 0;
				if (!depend_DP) o.DP = 0;
				if (!is_indirect) o.indirect_base_pointer = 0;
			}
		}

		if (opcode == 0x82) {
			// BRL
			uint16_t operand16 = data[1]|(data[2]<<8);
			const Pointer branch_target = branch16(pc, operand16);
			proposals[branch_target] = "";
		} else if (branches[opcode]) {
			const Pointer branch_target = branch8(pc, data[1]);
			proposals[branch_target] = "";
		} else {
			// Sort and make variants unique
			std::sort(variants.begin(), variants.end());

			uint32_t num_unique_variants = 0;

			// Remove duplicates
			for (uint32_t source_idx = 0; source_idx < variants.size(); source_idx++) {
				if (num_unique_variants == 0 || variants[source_idx] != variants[num_unique_variants - 1]) {
					variants[num_unique_variants++] = variants[source_idx];
				}
			}
			variants.resize(num_unique_variants);

			if (is_jump) {
				for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {
					const OpInfo &vit = variants[variant_idx];
					if (vit.jump_target == INVALID_POINTER)
						continue;
					StringBuilder sb;
					sb.clear();
					if (depend_X)
						sb.format("[X=%04X]", vit.X);
					proposals[vit.jump_target] = sb.c_str();
				}

			} else if (!is_predicted) {

				for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {

					const OpInfo &vit = variants[variant_idx];

					StringBuilder ranges;
					if (depend_X||depend_Y) {
						if (depend_X) ranges.add("X=");
						if (depend_Y) ranges.add("Y=");

						int max_size = 80;
						int skipped = 0;

						bool first = true;

						Range r;
						r.add(depend_X?vit.X:vit.Y);
						for (uint32_t v = variant_idx+1; v < variants.size(); ++v) {
							const OpInfo &vi = variants[v];
							if (vi.DB != vit.DB || vi.DP != vit.DP)
								break;
							int value = depend_X ? variants[v].X : variants[v].Y;
							if (r.fits(value)) {
								r.add(value);
							} else {
								bool skip = ranges.length() >= max_size;
								if (!skip) {
									if (!first) ranges.add(", "); first = false;
									r.format(ranges);
								} else {
									skipped++;
								}
								r.reset();
								r.add(value);
							}
							variant_idx++;
						}
						if (skipped == 0) {
							if (!first) ranges.add(", "); first = false;
							r.format(ranges);
						} else {
							ranges.format(" and %d more", skipped);
						}
					}

					CPURegisters reg;
					reg.P = vit.P;
					reg.dp = vit.DP;
					reg.db = vit.DB;
					reg.pc = pc & 0xFFFF;
					reg.pb = pc >> 16;
					reg.reg_X = 0; // Start at 0 to get base pointer
					reg.reg_Y = 0; // Start at 0 to get base pointer
					MagicByte rb(0);
					MagicWord ra(0);
					ra.set_unknown();
					rb.set_unknown();
					assert(!ra.isKnown() && !rb.isKnown());
					const ResultType r = evaluateOp(rom_accessor, data, reg, &rb, &ra, nullptr, nullptr, nullptr, nullptr);

					if (r == SA_ADRESS && rb.isKnown() && ra.isKnown()) {
						const Pointer p = rom_accessor.lorom_bank_remap((rb.value << 16) | ra.value);

						//if((p>>16)!=rb.value) // data bank was removed due to adressing being shuffled into 7E
						// depend_DB = false;

						if (proposals.find(p) != proposals.end())
							continue;

						std::string use_comment;

						bool has_remark = depend_DB || depend_DP || !ranges.empty();

						StringBuilder sb;
						if (!use_comment.empty()) {
							sb.add(use_comment);
							if (has_remark)
								sb.add(" ");
						}
						bool first = true;
						if (has_remark)
							sb.add("[");
						if (depend_DB) {
							if (!first) sb.add(" "); first = false;
							sb.format("DB=%X", vit.DB);
						}
						if (depend_DP) {
							if (!first) sb.add(" "); first = false;
							sb.format("DP=%X", vit.DP);
						}
						if (!ranges.empty()) {
							if (!first) sb.add(" "); first = false;
							sb.add(ranges.c_str());
						}
						if (has_remark)
							sb.add("]");

						proposals[p] = sb.c_str();
					}
				}
			}
		}

		std::string line_comment;
		if (!emitted_label) {
			annotations.line_info(pc, nullptr, &line_comment, nullptr, false);
		}

		auto variant_writer = [&annotations, &line_comment, is_jump](StringBuilder &ss, const Pointer target_pointer, const Proposal &p, bool name_in_code) {
			ss.clear();
			std::string use_comment, pointer_comment = p;
			const std::string name = annotations.label(target_pointer, &use_comment, is_jump);

			if (!name_in_code || name.empty()) {
				if (!name.empty()) {
					ss.format("%s ", name.c_str()); // Name
				} else {
					ss.format("%06X ", target_pointer);
				}
			}

			bool first = true;
			if (!line_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(line_comment);
			}
			if (!use_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(use_comment);
			}
			if (!pointer_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(pointer_comment);
			}
			return name;
		};

		StringBuilder ss;

		if (proposals.size() == 1) {

			// All variant agree that this is the only choice
			// If we have a valid label we might be able to use that in the op-code
			// It might not be possible to codify it though since it might generate the wrong opcode
			// If target_label is non-empty we can codify using a label

			const bool name_in_code = strcmp(target_label, "") != 0;
			std::string name = variant_writer(ss, proposals.begin()->first, proposals.begin()->second, name_in_code);

			if (!name_in_code || name.empty()) {
				writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, target, ss.c_str(), accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			} else {
				char wow[256];
				sprintf(wow, target_label, name.c_str());
				writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, wow, ss.c_str(), accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			}
		} else {
			writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, target, line_comment, accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			// List all possible targets in comments!
			for (auto pit = proposals.begin(); pit != proposals.end(); ++pit) {
				std::string name = variant_writer(ss, pit->first, pit->second, false);
				writer.writeComment(pc, ss.c_str(), 0, 10);
			}
		}

		if (is_indirect && !is_jump && !is_predicted) {
			for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {

				const OpInfo &v = variants[variant_idx];

				StringBuilder ranges;
					
				if (depend_X||depend_Y) {
					if (depend_X) ranges.add(" X=");
					if (depend_Y) ranges.add(" Y=");
					Range r;
					bool first = true;
					int skipped = 0;

					r.add(depend_X ? v.X : v.Y);

					for (uint32_t vi2 = variant_idx+1; vi2 < variants.size(); ++vi2) {
						const OpInfo &v2 = variants[vi2];
						if (v.DB != v2.DB) break;
						if (v.DP != v2.DP) break;
						if (v.indirect_base_pointer != v2.indirect_base_pointer) break;

						int value = depend_X ? v2.X : v2.Y;

						if (r.fits(value)) {
							r.add(value);
								
						} else {
							if (ranges.length() > 128) {
								skipped++;
							} else {
								if (!first)	ranges.add(", "); first = false;
								r.format(ranges);
							}
							r.reset();
						}

						variant_idx++;
					}
					if (skipped==0 && r.N != 0) {
						if (!first)	ranges.add(", "); first = false;
						r.format(ranges);
					} else if (skipped !=0) {
						ranges.format(" (and %d more)", skipped);
					}
				}

				StringBuilder ss;

				std::string use_comment;
				const std::string name = annotations.label(v.indirect_base_pointer, &use_comment, is_jump);

				ss.format("indirect base=%06X", v.indirect_base_pointer);
				if (depend_DP) ss.format(", DP=%X", v.DP);
				if (depend_DB) ss.format(", DB=%X", v.DB);

				if (!ranges.empty()) {
					ss.add(ranges.c_str());
				}

				if (!name.empty()) {
					ss.add(" - ", name);
				}

				if (!use_comment.empty()) {
					ss.add(" - ", use_comment);
				}

				writer.writeComment(pc, ss.c_str(), 0, 10);
			}
		}

		while (next_dma_event < trace.dma_transfers.size() && trace.dma_transfers[next_dma_event].pc == pc) {
			const DmaTransfer &d = trace.dma_transfers[next_dma_event++];
			StringBuilder ss;
			bool reverse = d.flags & DmaTransfer::REVERSE_TRANSFER;
			int num_bytes = d.transfer_bytes == 0 ? 0x10000 : d.transfer_bytes;
			assert(d.b_address == 0x80); // So we can detect that we've enabled more and can improve
			ss.format("dma-event $%02X:%04X %s $%02X:%04X (via $2180), $%X/%d bytes%s%s", d.a_bank, d.a_address, reverse ? "<-" : "->", d.wram>>16, d.wram&0xFFFF, num_bytes, num_bytes, d.flags & DmaTransfer::A_ADDRESS_DECREMENT ?" (decrease A)":"", d.flags & DmaTransfer::A_ADDRESS_FIXED ? " (A fixed)":"");
			writer.writeComment(pc, ss.c_str(), 0, 10);
		}
	}
}